

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_IteratedLogicalExprPrecedence_Test::
~ExprWriterTest_IteratedLogicalExprPrecedence_Test
          (ExprWriterTest_IteratedLogicalExprPrecedence_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, IteratedLogicalExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  LogicalExpr args[] = {MakeBinaryLogical(ex::AND, l0, l0), l0};
  CHECK_WRITE("if /* forall */ ((0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args), n1, n0));
  args[0] = MakeBinaryLogical(ex::OR, l0, l0);
  CHECK_WRITE("if /* exists */ ((0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args), n1, n0));
  args[0] = l0;
  LogicalExpr args2[] = {MakeIteratedLogical(ex::FORALL, args), l0};
  CHECK_WRITE("if /* forall */ (/* forall */ (0 && 0) && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args2), n1, n0));
  args2[0] = MakeIteratedLogical(ex::EXISTS, args);
  CHECK_WRITE("if /* exists */ (/* exists */ (0 || 0) || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args2), n1, n0));
}